

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio.c
# Opt level: O0

int synthesize_ino_value(cpio_conflict *cpio,archive_entry *entry)

{
  uint uVar1;
  int64_t iVar2;
  long lVar3;
  anon_struct_16_2_441de842 *paVar4;
  size_t local_50;
  void *newlist;
  size_t newsize;
  size_t i;
  int ino_new;
  int64_t ino;
  archive_entry *entry_local;
  cpio_conflict *cpio_local;
  
  iVar2 = archive_entry_ino64(entry);
  if (iVar2 == 0) {
    cpio_local._4_4_ = 0;
  }
  else {
    uVar1 = archive_entry_nlink(entry);
    if (uVar1 < 2) {
      lVar3 = cpio->ino_next + 1;
      cpio->ino_next = lVar3;
      cpio_local._4_4_ = (int)lVar3;
    }
    else {
      for (newsize = 0; newsize < cpio->ino_list_next; newsize = newsize + 1) {
        if (cpio->ino_list[newsize].old == iVar2) {
          return cpio->ino_list[newsize].new;
        }
      }
      lVar3 = cpio->ino_next + 1;
      cpio->ino_next = lVar3;
      cpio_local._4_4_ = (int)lVar3;
      if (cpio->ino_list_size <= cpio->ino_list_next) {
        if (cpio->ino_list_size < 0x200) {
          local_50 = 0x200;
        }
        else {
          local_50 = cpio->ino_list_size << 1;
        }
        paVar4 = (anon_struct_16_2_441de842 *)realloc(cpio->ino_list,local_50 << 4);
        if (paVar4 == (anon_struct_16_2_441de842 *)0x0) {
          return -1;
        }
        cpio->ino_list_size = local_50;
        cpio->ino_list = paVar4;
      }
      cpio->ino_list[cpio->ino_list_next].old = iVar2;
      cpio->ino_list[cpio->ino_list_next].new = cpio_local._4_4_;
      cpio->ino_list_next = cpio->ino_list_next + 1;
    }
  }
  return cpio_local._4_4_;
}

Assistant:

static int
synthesize_ino_value(struct cpio *cpio, struct archive_entry *entry)
{
	int64_t ino = archive_entry_ino64(entry);
	int ino_new;
	size_t i;

	/*
	 * If no index number was given, don't assign one.  In
	 * particular, this handles the end-of-archive marker
	 * correctly by giving it a zero index value.  (This is also
	 * why we start our synthetic index numbers with one below.)
	 */
	if (ino == 0)
		return (0);

	/* Don't store a mapping if we don't need to. */
	if (archive_entry_nlink(entry) < 2) {
		return (int)(++cpio->ino_next);
	}

	/* Look up old ino; if we have it, this is a hardlink
	 * and we reuse the same value. */
	for (i = 0; i < cpio->ino_list_next; ++i) {
		if (cpio->ino_list[i].old == ino)
			return (cpio->ino_list[i].new);
	}

	/* Assign a new index number. */
	ino_new = (int)(++cpio->ino_next);

	/* Ensure space for the new mapping. */
	if (cpio->ino_list_size <= cpio->ino_list_next) {
		size_t newsize = cpio->ino_list_size < 512
		    ? 512 : cpio->ino_list_size * 2;
		void *newlist = realloc(cpio->ino_list,
		    sizeof(cpio->ino_list[0]) * newsize);
		if (newlist == NULL)
			return (-1);

		cpio->ino_list_size = newsize;
		cpio->ino_list = newlist;
	}

	/* Record and return the new value. */
	cpio->ino_list[cpio->ino_list_next].old = ino;
	cpio->ino_list[cpio->ino_list_next].new = ino_new;
	++cpio->ino_list_next;
	return (ino_new);
}